

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-error.c
# Opt level: O3

int run_test_error_message(void)

{
  int iVar1;
  char *pcVar2;
  int64_t eval_b;
  char buf [32];
  long local_28 [5];
  
  pcVar2 = (char *)uv_strerror(0);
  iVar1 = strcmp(pcVar2,"Success");
  if (iVar1 != 0) {
    puts("i18n error messages detected, skipping test.");
    return 0;
  }
  pcVar2 = (char *)uv_strerror(0xffffffea);
  pcVar2 = strstr(pcVar2,"Success");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)uv_strerror(0x539);
    iVar1 = strcmp(pcVar2,"Unknown error");
    local_28[0] = (long)iVar1;
    if (local_28[0] != 0) goto LAB_00186916;
    pcVar2 = (char *)uv_strerror(0xfffffac7);
    iVar1 = strcmp(pcVar2,"Unknown error");
    local_28[0] = (long)iVar1;
    if (local_28[0] != 0) goto LAB_00186925;
    pcVar2 = (char *)uv_strerror_r(0xffffffea,local_28,0x20);
    pcVar2 = strstr(pcVar2,"Success");
    if (pcVar2 != (char *)0x0) goto LAB_00186934;
    pcVar2 = (char *)uv_strerror_r(0x539,local_28,0x20);
    pcVar2 = strstr(pcVar2,"1337");
    if (pcVar2 == (char *)0x0) goto LAB_0018693c;
    pcVar2 = (char *)uv_strerror_r(0xfffffac7,local_28,0x20);
    pcVar2 = strstr(pcVar2,"-1337");
    if (pcVar2 != (char *)0x0) {
      return 0;
    }
  }
  else {
    run_test_error_message_cold_1();
LAB_00186916:
    run_test_error_message_cold_2();
LAB_00186925:
    run_test_error_message_cold_3();
LAB_00186934:
    run_test_error_message_cold_4();
LAB_0018693c:
    run_test_error_message_cold_6();
  }
  run_test_error_message_cold_5();
  iVar1 = uv_translate_sys_error(1);
  if (iVar1 == -1) {
    iVar1 = uv_translate_sys_error(0x20);
    if (iVar1 != -0x20) goto LAB_00186a7b;
    iVar1 = uv_translate_sys_error(0x16);
    if (iVar1 != -0x16) goto LAB_00186a8a;
    iVar1 = uv_translate_sys_error(0xffffffea);
    if (iVar1 != -0x16) goto LAB_00186a99;
    iVar1 = uv_translate_sys_error(0xffffffde);
    if (iVar1 != -0x22) goto LAB_00186aa8;
    iVar1 = uv_translate_sys_error(0xfffffff3);
    if (iVar1 == -0xd) {
      iVar1 = uv_translate_sys_error(0);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00186ac6;
    }
  }
  else {
    run_test_sys_error_cold_1();
LAB_00186a7b:
    run_test_sys_error_cold_2();
LAB_00186a8a:
    run_test_sys_error_cold_3();
LAB_00186a99:
    run_test_sys_error_cold_4();
LAB_00186aa8:
    run_test_sys_error_cold_5();
  }
  run_test_sys_error_cold_6();
LAB_00186ac6:
  run_test_sys_error_cold_7();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fail-always.c"
          ,0x1b,"Yes, it always fails");
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(error_message) {
#if defined(__ASAN__)
  RETURN_SKIP("Test does not currently work in ASAN");
#endif
  char buf[32];

  /* Cop out. Can't do proper checks on systems with
   * i18n-ized error messages...
   */
  if (strcmp(uv_strerror(0), "Success") != 0) {
    printf("i18n error messages detected, skipping test.\n");
    return 0;
  }

  ASSERT_NULL(strstr(uv_strerror(UV_EINVAL), "Success"));
  ASSERT_OK(strcmp(uv_strerror(1337), "Unknown error"));
  ASSERT_OK(strcmp(uv_strerror(-1337), "Unknown error"));

  ASSERT_NULL(strstr(uv_strerror_r(UV_EINVAL, buf, sizeof(buf)), "Success"));
  ASSERT_NOT_NULL(strstr(uv_strerror_r(1337, buf, sizeof(buf)), "1337"));
  ASSERT_NOT_NULL(strstr(uv_strerror_r(-1337, buf, sizeof(buf)), "-1337"));

  return 0;
}